

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_NV_half_float(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_NV_half_float != 0) {
    glad_glVertex2hNV = (PFNGLVERTEX2HNVPROC)(*load)("glVertex2hNV");
    glad_glVertex2hvNV = (PFNGLVERTEX2HVNVPROC)(*load)("glVertex2hvNV");
    glad_glVertex3hNV = (PFNGLVERTEX3HNVPROC)(*load)("glVertex3hNV");
    glad_glVertex3hvNV = (PFNGLVERTEX3HVNVPROC)(*load)("glVertex3hvNV");
    glad_glVertex4hNV = (PFNGLVERTEX4HNVPROC)(*load)("glVertex4hNV");
    glad_glVertex4hvNV = (PFNGLVERTEX4HVNVPROC)(*load)("glVertex4hvNV");
    glad_glNormal3hNV = (PFNGLNORMAL3HNVPROC)(*load)("glNormal3hNV");
    glad_glNormal3hvNV = (PFNGLNORMAL3HVNVPROC)(*load)("glNormal3hvNV");
    glad_glColor3hNV = (PFNGLCOLOR3HNVPROC)(*load)("glColor3hNV");
    glad_glColor3hvNV = (PFNGLCOLOR3HVNVPROC)(*load)("glColor3hvNV");
    glad_glColor4hNV = (PFNGLCOLOR4HNVPROC)(*load)("glColor4hNV");
    glad_glColor4hvNV = (PFNGLCOLOR4HVNVPROC)(*load)("glColor4hvNV");
    glad_glTexCoord1hNV = (PFNGLTEXCOORD1HNVPROC)(*load)("glTexCoord1hNV");
    glad_glTexCoord1hvNV = (PFNGLTEXCOORD1HVNVPROC)(*load)("glTexCoord1hvNV");
    glad_glTexCoord2hNV = (PFNGLTEXCOORD2HNVPROC)(*load)("glTexCoord2hNV");
    glad_glTexCoord2hvNV = (PFNGLTEXCOORD2HVNVPROC)(*load)("glTexCoord2hvNV");
    glad_glTexCoord3hNV = (PFNGLTEXCOORD3HNVPROC)(*load)("glTexCoord3hNV");
    glad_glTexCoord3hvNV = (PFNGLTEXCOORD3HVNVPROC)(*load)("glTexCoord3hvNV");
    glad_glTexCoord4hNV = (PFNGLTEXCOORD4HNVPROC)(*load)("glTexCoord4hNV");
    glad_glTexCoord4hvNV = (PFNGLTEXCOORD4HVNVPROC)(*load)("glTexCoord4hvNV");
    glad_glMultiTexCoord1hNV = (PFNGLMULTITEXCOORD1HNVPROC)(*load)("glMultiTexCoord1hNV");
    glad_glMultiTexCoord1hvNV = (PFNGLMULTITEXCOORD1HVNVPROC)(*load)("glMultiTexCoord1hvNV");
    glad_glMultiTexCoord2hNV = (PFNGLMULTITEXCOORD2HNVPROC)(*load)("glMultiTexCoord2hNV");
    glad_glMultiTexCoord2hvNV = (PFNGLMULTITEXCOORD2HVNVPROC)(*load)("glMultiTexCoord2hvNV");
    glad_glMultiTexCoord3hNV = (PFNGLMULTITEXCOORD3HNVPROC)(*load)("glMultiTexCoord3hNV");
    glad_glMultiTexCoord3hvNV = (PFNGLMULTITEXCOORD3HVNVPROC)(*load)("glMultiTexCoord3hvNV");
    glad_glMultiTexCoord4hNV = (PFNGLMULTITEXCOORD4HNVPROC)(*load)("glMultiTexCoord4hNV");
    glad_glMultiTexCoord4hvNV = (PFNGLMULTITEXCOORD4HVNVPROC)(*load)("glMultiTexCoord4hvNV");
    glad_glFogCoordhNV = (PFNGLFOGCOORDHNVPROC)(*load)("glFogCoordhNV");
    glad_glFogCoordhvNV = (PFNGLFOGCOORDHVNVPROC)(*load)("glFogCoordhvNV");
    glad_glSecondaryColor3hNV = (PFNGLSECONDARYCOLOR3HNVPROC)(*load)("glSecondaryColor3hNV");
    glad_glSecondaryColor3hvNV = (PFNGLSECONDARYCOLOR3HVNVPROC)(*load)("glSecondaryColor3hvNV");
    glad_glVertexWeighthNV = (PFNGLVERTEXWEIGHTHNVPROC)(*load)("glVertexWeighthNV");
    glad_glVertexWeighthvNV = (PFNGLVERTEXWEIGHTHVNVPROC)(*load)("glVertexWeighthvNV");
    glad_glVertexAttrib1hNV = (PFNGLVERTEXATTRIB1HNVPROC)(*load)("glVertexAttrib1hNV");
    glad_glVertexAttrib1hvNV = (PFNGLVERTEXATTRIB1HVNVPROC)(*load)("glVertexAttrib1hvNV");
    glad_glVertexAttrib2hNV = (PFNGLVERTEXATTRIB2HNVPROC)(*load)("glVertexAttrib2hNV");
    glad_glVertexAttrib2hvNV = (PFNGLVERTEXATTRIB2HVNVPROC)(*load)("glVertexAttrib2hvNV");
    glad_glVertexAttrib3hNV = (PFNGLVERTEXATTRIB3HNVPROC)(*load)("glVertexAttrib3hNV");
    glad_glVertexAttrib3hvNV = (PFNGLVERTEXATTRIB3HVNVPROC)(*load)("glVertexAttrib3hvNV");
    glad_glVertexAttrib4hNV = (PFNGLVERTEXATTRIB4HNVPROC)(*load)("glVertexAttrib4hNV");
    glad_glVertexAttrib4hvNV = (PFNGLVERTEXATTRIB4HVNVPROC)(*load)("glVertexAttrib4hvNV");
    glad_glVertexAttribs1hvNV = (PFNGLVERTEXATTRIBS1HVNVPROC)(*load)("glVertexAttribs1hvNV");
    glad_glVertexAttribs2hvNV = (PFNGLVERTEXATTRIBS2HVNVPROC)(*load)("glVertexAttribs2hvNV");
    glad_glVertexAttribs3hvNV = (PFNGLVERTEXATTRIBS3HVNVPROC)(*load)("glVertexAttribs3hvNV");
    glad_glVertexAttribs4hvNV = (PFNGLVERTEXATTRIBS4HVNVPROC)(*load)("glVertexAttribs4hvNV");
  }
  return;
}

Assistant:

static void load_GL_NV_half_float(GLADloadproc load) {
	if(!GLAD_GL_NV_half_float) return;
	glad_glVertex2hNV = (PFNGLVERTEX2HNVPROC)load("glVertex2hNV");
	glad_glVertex2hvNV = (PFNGLVERTEX2HVNVPROC)load("glVertex2hvNV");
	glad_glVertex3hNV = (PFNGLVERTEX3HNVPROC)load("glVertex3hNV");
	glad_glVertex3hvNV = (PFNGLVERTEX3HVNVPROC)load("glVertex3hvNV");
	glad_glVertex4hNV = (PFNGLVERTEX4HNVPROC)load("glVertex4hNV");
	glad_glVertex4hvNV = (PFNGLVERTEX4HVNVPROC)load("glVertex4hvNV");
	glad_glNormal3hNV = (PFNGLNORMAL3HNVPROC)load("glNormal3hNV");
	glad_glNormal3hvNV = (PFNGLNORMAL3HVNVPROC)load("glNormal3hvNV");
	glad_glColor3hNV = (PFNGLCOLOR3HNVPROC)load("glColor3hNV");
	glad_glColor3hvNV = (PFNGLCOLOR3HVNVPROC)load("glColor3hvNV");
	glad_glColor4hNV = (PFNGLCOLOR4HNVPROC)load("glColor4hNV");
	glad_glColor4hvNV = (PFNGLCOLOR4HVNVPROC)load("glColor4hvNV");
	glad_glTexCoord1hNV = (PFNGLTEXCOORD1HNVPROC)load("glTexCoord1hNV");
	glad_glTexCoord1hvNV = (PFNGLTEXCOORD1HVNVPROC)load("glTexCoord1hvNV");
	glad_glTexCoord2hNV = (PFNGLTEXCOORD2HNVPROC)load("glTexCoord2hNV");
	glad_glTexCoord2hvNV = (PFNGLTEXCOORD2HVNVPROC)load("glTexCoord2hvNV");
	glad_glTexCoord3hNV = (PFNGLTEXCOORD3HNVPROC)load("glTexCoord3hNV");
	glad_glTexCoord3hvNV = (PFNGLTEXCOORD3HVNVPROC)load("glTexCoord3hvNV");
	glad_glTexCoord4hNV = (PFNGLTEXCOORD4HNVPROC)load("glTexCoord4hNV");
	glad_glTexCoord4hvNV = (PFNGLTEXCOORD4HVNVPROC)load("glTexCoord4hvNV");
	glad_glMultiTexCoord1hNV = (PFNGLMULTITEXCOORD1HNVPROC)load("glMultiTexCoord1hNV");
	glad_glMultiTexCoord1hvNV = (PFNGLMULTITEXCOORD1HVNVPROC)load("glMultiTexCoord1hvNV");
	glad_glMultiTexCoord2hNV = (PFNGLMULTITEXCOORD2HNVPROC)load("glMultiTexCoord2hNV");
	glad_glMultiTexCoord2hvNV = (PFNGLMULTITEXCOORD2HVNVPROC)load("glMultiTexCoord2hvNV");
	glad_glMultiTexCoord3hNV = (PFNGLMULTITEXCOORD3HNVPROC)load("glMultiTexCoord3hNV");
	glad_glMultiTexCoord3hvNV = (PFNGLMULTITEXCOORD3HVNVPROC)load("glMultiTexCoord3hvNV");
	glad_glMultiTexCoord4hNV = (PFNGLMULTITEXCOORD4HNVPROC)load("glMultiTexCoord4hNV");
	glad_glMultiTexCoord4hvNV = (PFNGLMULTITEXCOORD4HVNVPROC)load("glMultiTexCoord4hvNV");
	glad_glFogCoordhNV = (PFNGLFOGCOORDHNVPROC)load("glFogCoordhNV");
	glad_glFogCoordhvNV = (PFNGLFOGCOORDHVNVPROC)load("glFogCoordhvNV");
	glad_glSecondaryColor3hNV = (PFNGLSECONDARYCOLOR3HNVPROC)load("glSecondaryColor3hNV");
	glad_glSecondaryColor3hvNV = (PFNGLSECONDARYCOLOR3HVNVPROC)load("glSecondaryColor3hvNV");
	glad_glVertexWeighthNV = (PFNGLVERTEXWEIGHTHNVPROC)load("glVertexWeighthNV");
	glad_glVertexWeighthvNV = (PFNGLVERTEXWEIGHTHVNVPROC)load("glVertexWeighthvNV");
	glad_glVertexAttrib1hNV = (PFNGLVERTEXATTRIB1HNVPROC)load("glVertexAttrib1hNV");
	glad_glVertexAttrib1hvNV = (PFNGLVERTEXATTRIB1HVNVPROC)load("glVertexAttrib1hvNV");
	glad_glVertexAttrib2hNV = (PFNGLVERTEXATTRIB2HNVPROC)load("glVertexAttrib2hNV");
	glad_glVertexAttrib2hvNV = (PFNGLVERTEXATTRIB2HVNVPROC)load("glVertexAttrib2hvNV");
	glad_glVertexAttrib3hNV = (PFNGLVERTEXATTRIB3HNVPROC)load("glVertexAttrib3hNV");
	glad_glVertexAttrib3hvNV = (PFNGLVERTEXATTRIB3HVNVPROC)load("glVertexAttrib3hvNV");
	glad_glVertexAttrib4hNV = (PFNGLVERTEXATTRIB4HNVPROC)load("glVertexAttrib4hNV");
	glad_glVertexAttrib4hvNV = (PFNGLVERTEXATTRIB4HVNVPROC)load("glVertexAttrib4hvNV");
	glad_glVertexAttribs1hvNV = (PFNGLVERTEXATTRIBS1HVNVPROC)load("glVertexAttribs1hvNV");
	glad_glVertexAttribs2hvNV = (PFNGLVERTEXATTRIBS2HVNVPROC)load("glVertexAttribs2hvNV");
	glad_glVertexAttribs3hvNV = (PFNGLVERTEXATTRIBS3HVNVPROC)load("glVertexAttribs3hvNV");
	glad_glVertexAttribs4hvNV = (PFNGLVERTEXATTRIBS4HVNVPROC)load("glVertexAttribs4hvNV");
}